

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O2

void array_suite::test_one(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  writer writer;
  undefined4 local_a4;
  size_type local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  basic_writer<16UL> local_78;
  
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&local_78,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
  local_a0 = trial::protocol::bintoken::basic_writer<16UL>::
             overloader<trial::protocol::bintoken::token::begin_array,_void>::value(&local_78);
  local_a4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value<token::begin_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x21b,"void array_suite::test_one()",&local_a0,&local_a4);
  local_a0 = trial::protocol::bintoken::detail::basic_encoder<16UL>::value(&local_78.encoder,false);
  local_a4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(false)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x21c,"void array_suite::test_one()",&local_a0,&local_a4);
  local_a0 = trial::protocol::bintoken::basic_writer<16UL>::
             overloader<trial::protocol::bintoken::token::end_array,_void>::value(&local_78);
  local_a4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value<token::end_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x21d,"void array_suite::test_one()",&local_a0,&local_a4);
  local_a0 = (long)local_98._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98._M_impl.super__Vector_impl_data._M_start;
  local_a4 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x21e,"void array_suite::test_one()",&local_a0,&local_a4);
  local_a0._0_4_ = 0x92;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("result[0]","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x21f,"void array_suite::test_one()",local_98._M_impl.super__Vector_impl_data._M_start
             ,&local_a0);
  local_a0._0_4_ = 0x80;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[1]","0x80",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x220,"void array_suite::test_one()",
             local_98._M_impl.super__Vector_impl_data._M_start + 1,&local_a0);
  local_a0 = CONCAT44(local_a0._4_4_,0x93);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("result[2]","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x221,"void array_suite::test_one()",
             local_98._M_impl.super__Vector_impl_data._M_start + 2,&local_a0);
  trial::protocol::bintoken::basic_writer<16UL>::~basic_writer(&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  return;
}

Assistant:

void test_uint8()
{
    std::vector<output_type> result;
    format::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x00)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x7F)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xD0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xFF)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 0x7F);
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 0xD0);
    TRIAL_PROTOCOL_TEST_EQUAL(result[4], 0xFF);
}